

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O2

void __thiscall
BattleWithLandlord::AlphaBetaDFS
          (BattleWithLandlord *this,BattleWithLandlord *bld,int *score,bool *res)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = GetBestMove(bld,0x80);
  *score = iVar2;
  bVar1 = iVar2 - 0x7149U < 0xffff1d6f;
  if (bVar1) {
    std::mutex::lock(&this->_mtx);
    this->_stopsearch = true;
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mtx);
  }
  *res = bVar1;
  return;
}

Assistant:

void BattleWithLandlord::AlphaBetaDFS(BattleWithLandlord *bld, int &score, bool &res) {

    score = bld->GetBestMove(128);
    if (score > WIN_SCORE || score < -WIN_SCORE) {
        {
            std::lock_guard<std::mutex> lck(_mtx);
            _stopsearch = true;
        }
        res = true;
    } else {
        res = false;
    }
}